

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::SelectCols::dim_forward
          (Dim *__return_storage_ptr__,SelectCols *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  uint uVar2;
  pointer pDVar3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  ostream *poVar7;
  invalid_argument *this_00;
  uint local_18 [2];
  
  pDVar3 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pDVar3 == 0x24) && (pDVar3->nd == 2)) {
    local_18[0] = pDVar3->d[0];
    puVar4 = (this->pcols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar5 = (this->pcols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __return_storage_ptr__->nd = 0;
    __return_storage_ptr__->bd = 1;
    lVar6 = 0;
    local_18[1] = (int)((ulong)((long)puVar4 - (long)puVar5) >> 2);
    do {
      uVar1 = __return_storage_ptr__->nd;
      uVar2 = *(uint *)((long)local_18 + lVar6);
      lVar6 = lVar6 + 4;
      __return_storage_ptr__->nd = uVar1 + 1;
      __return_storage_ptr__->d[uVar1] = uVar2;
    } while (lVar6 != 8);
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Bad arguments in SelectCols: ",0x1d);
  poVar7 = operator<<((ostream *)&std::cerr,xs);
  std::endl<char,std::char_traits<char>>(poVar7);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid arguments to SelectCols");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim SelectCols::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1 || xs[0].ndims() != 2) {
    cerr << "Bad arguments in SelectCols: " << xs << endl;
    throw std::invalid_argument("invalid arguments to SelectCols");
  }
  unsigned ncols = pcols->size();
  return Dim({xs[0].rows(), ncols});
}